

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool ContextualCheckBlockHeader
               (CBlockHeader *block,BlockValidationState *state,BlockManager *blockman,
               ChainstateManager *chainman,CBlockIndex *pindexPrev)

{
  uint uVar1;
  long lVar2;
  ConstevalFormatString<2U> fmt;
  string_view source_file;
  string_view logging_function;
  strong_ordering sVar3;
  bool bVar4;
  uint uVar5;
  Params *pPVar6;
  CBlockIndex *pCVar7;
  int64_t iVar8;
  int64_t iVar9;
  long lVar10;
  long in_RCX;
  char *in_RSI;
  int *in_RDI;
  long in_R8;
  long in_FS_OFFSET;
  CBlockIndex *pcheckpoint;
  Params *consensusParams;
  int nHeight;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 uVar11;
  undefined2 in_stack_fffffffffffffccc;
  BuriedDeployment in_stack_fffffffffffffcce;
  ChainstateManager *in_stack_fffffffffffffcd0;
  char *debug_message;
  CBlockIndex *in_stack_fffffffffffffcd8;
  char *in_stack_fffffffffffffce0;
  BlockValidationResult BVar12;
  CBlockIndex *in_stack_fffffffffffffce8;
  undefined6 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf6;
  undefined1 in_stack_fffffffffffffcf7;
  CCheckpointData *in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  allocator<char> *in_stack_fffffffffffffd08;
  allocator<char> *__a;
  char *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  CBlockHeader *in_stack_fffffffffffffd28;
  CBlockIndex *in_stack_fffffffffffffd30;
  undefined8 in_stack_fffffffffffffd38;
  int source_line;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  size_t in_stack_fffffffffffffd80;
  char *reject_reason;
  size_t in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  bool local_1dc;
  allocator<char> local_1db;
  undefined1 local_1da [36];
  allocator<char> local_1b6;
  allocator<char> local_1b5;
  allocator<char> local_1b4;
  allocator<char> local_1b3;
  allocator<char> local_1b2;
  allocator<char> local_1b1 [33];
  Level in_stack_fffffffffffffe70;
  int local_18c [3];
  char (*in_stack_fffffffffffffe80) [27];
  int *in_stack_fffffffffffffe88;
  
  source_line = (int)((ulong)in_stack_fffffffffffffd38 >> 0x20);
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffcd8,(char *)in_stack_fffffffffffffcd0,
             CONCAT22(in_stack_fffffffffffffcce,in_stack_fffffffffffffccc),
             (AnnotatedMixin<std::recursive_mutex> *)0x7e274f);
  if (in_R8 == 0) {
    __assert_fail("pindexPrev != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x1039,
                  "bool ContextualCheckBlockHeader(const CBlockHeader &, BlockValidationState &, BlockManager &, const ChainstateManager &, const CBlockIndex *)"
                 );
  }
  local_18c[0] = *(int *)(in_R8 + 0x18) + 1;
  pPVar6 = ChainstateManager::GetConsensus
                     ((ChainstateManager *)
                      CONCAT26(in_stack_fffffffffffffcce,
                               CONCAT24(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)));
  uVar1 = in_RDI[0x12];
  uVar5 = GetNextWorkRequired(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                              (Params *)
                              CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
  if (uVar1 == uVar5) {
    if ((*(byte *)(in_RCX + 0x760) & 1) != 0) {
      ChainstateManager::GetParams
                ((ChainstateManager *)
                 CONCAT26(in_stack_fffffffffffffcce,
                          CONCAT24(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)));
      CChainParams::Checkpoints
                ((CChainParams *)
                 CONCAT26(in_stack_fffffffffffffcce,
                          CONCAT24(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)));
      pCVar7 = node::BlockManager::GetLastCheckpoint
                         ((BlockManager *)
                          CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                          in_stack_fffffffffffffcf8);
      if ((pCVar7 != (CBlockIndex *)0x0) && (local_18c[0] < pCVar7->nHeight)) {
        reject_reason = "ContextualCheckBlockHeader";
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce8,
                   in_stack_fffffffffffffce0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce8,
                   in_stack_fffffffffffffce0);
        BVar12 = (BlockValidationResult)((ulong)local_18c >> 0x20);
        debug_message = "ERROR: %s: forked chain older than last checkpoint (height %d)\n";
        uVar11 = 2;
        logging_function._M_str = in_stack_fffffffffffffd98;
        logging_function._M_len = in_stack_fffffffffffffd90;
        source_file._M_str = reject_reason;
        source_file._M_len = in_stack_fffffffffffffd80;
        fmt.fmt._7_1_ = in_stack_fffffffffffffd7f;
        fmt.fmt._0_7_ = in_stack_fffffffffffffd78;
        LogPrintFormatInternal<char[27],int>
                  (logging_function,source_file,source_line,(LogFlags)in_stack_fffffffffffffd30,
                   in_stack_fffffffffffffe70,fmt,in_stack_fffffffffffffe80,in_stack_fffffffffffffe88
                  );
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
        local_1dc = ValidationState<BlockValidationResult>::Invalid
                              ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffffce8,
                               BVar12,(string *)reject_reason,(string *)debug_message);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT26(in_stack_fffffffffffffcce,CONCAT24(in_stack_fffffffffffffccc,uVar11)));
        std::allocator<char>::~allocator(&local_1b2);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT26(in_stack_fffffffffffffcce,CONCAT24(in_stack_fffffffffffffccc,uVar11)));
        std::allocator<char>::~allocator(local_1b1);
        goto LAB_007e32c1;
      }
    }
    BVar12 = (BlockValidationResult)((ulong)in_stack_fffffffffffffce0 >> 0x20);
    iVar8 = CBlockHeader::GetBlockTime
                      ((CBlockHeader *)
                       CONCAT26(in_stack_fffffffffffffcce,
                                CONCAT24(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)));
    iVar9 = CBlockIndex::GetMedianTimePast(in_stack_fffffffffffffce8);
    if (iVar9 < iVar8) {
      if (((pPVar6->enforce_BIP94 & 1U) != 0) &&
         (lVar10 = (long)local_18c[0],
         iVar8 = Consensus::Params::DifficultyAdjustmentInterval
                           ((Params *)
                            CONCAT26(in_stack_fffffffffffffcce,
                                     CONCAT24(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)))
         , lVar10 % iVar8 == 0)) {
        iVar8 = CBlockHeader::GetBlockTime
                          ((CBlockHeader *)
                           CONCAT26(in_stack_fffffffffffffcce,
                                    CONCAT24(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)));
        iVar9 = CBlockIndex::GetBlockTime
                          ((CBlockIndex *)
                           CONCAT26(in_stack_fffffffffffffcce,
                                    CONCAT24(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)));
        if (iVar8 < iVar9 + -600) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
          local_1dc = ValidationState<BlockValidationResult>::Invalid
                                ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffffce8
                                 ,BVar12,(string *)in_stack_fffffffffffffcd8,
                                 (string *)in_stack_fffffffffffffcd0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT26(in_stack_fffffffffffffcce,
                              CONCAT24(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)));
          std::allocator<char>::~allocator(&local_1b6);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT26(in_stack_fffffffffffffcce,
                              CONCAT24(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)));
          std::allocator<char>::~allocator(&local_1b5);
          goto LAB_007e32c1;
        }
      }
      local_1da._26_8_ = CBlockHeader::Time((CBlockHeader *)in_stack_fffffffffffffcd8);
      local_1da._10_8_ = NodeClock::now();
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
                ((duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT26(in_stack_fffffffffffffcce,
                          CONCAT24(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)),
                 (long *)0x7e2f95);
      local_1da._18_8_ =
           std::chrono::operator+
                     ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)in_stack_fffffffffffffcd0,
                      (duration<long,_std::ratio<1L,_1L>_> *)
                      CONCAT26(in_stack_fffffffffffffcce,
                               CONCAT24(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)));
      sVar3 = std::chrono::
              operator<=><NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *
                         )in_stack_fffffffffffffcd0,
                         (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)CONCAT26(in_stack_fffffffffffffcce,
                                     CONCAT24(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)))
      ;
      std::__cmp_cat::__unspec::__unspec
                ((__unspec *)
                 CONCAT26(in_stack_fffffffffffffcce,
                          CONCAT24(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)),
                 (__unspec *)0x7e2fdf);
      bVar4 = std::operator>(sVar3._M_value);
      if (bVar4) {
        this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1da;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(this,in_RSI,in_stack_fffffffffffffd08);
        __a = &local_1db;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(this,in_RSI,__a);
        local_1dc = ValidationState<BlockValidationResult>::Invalid
                              ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffffce8,
                               BVar12,(string *)in_stack_fffffffffffffcd8,
                               (string *)in_stack_fffffffffffffcd0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT26(in_stack_fffffffffffffcce,
                            CONCAT24(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)));
        std::allocator<char>::~allocator(&local_1db);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT26(in_stack_fffffffffffffcce,
                            CONCAT24(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)));
        std::allocator<char>::~allocator((allocator<char> *)local_1da);
      }
      else if ((((*in_RDI < 2) &&
                (bVar4 = DeploymentActiveAfter<Consensus::BuriedDeployment>
                                   (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                                    in_stack_fffffffffffffcce), bVar4)) ||
               ((*in_RDI < 3 &&
                (bVar4 = DeploymentActiveAfter<Consensus::BuriedDeployment>
                                   (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                                    in_stack_fffffffffffffcce), bVar4)))) ||
              ((*in_RDI < 4 &&
               (bVar4 = DeploymentActiveAfter<Consensus::BuriedDeployment>
                                  (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                                   in_stack_fffffffffffffcce), bVar4)))) {
        tinyformat::format<int>
                  (in_RSI,(int *)CONCAT17(in_stack_fffffffffffffcf7,
                                          CONCAT16(in_stack_fffffffffffffcf6,
                                                   in_stack_fffffffffffffcf0)));
        tinyformat::format<int>
                  (in_RSI,(int *)CONCAT17(in_stack_fffffffffffffcf7,
                                          CONCAT16(in_stack_fffffffffffffcf6,
                                                   in_stack_fffffffffffffcf0)));
        local_1dc = ValidationState<BlockValidationResult>::Invalid
                              ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffffce8,
                               BVar12,(string *)in_stack_fffffffffffffcd8,
                               (string *)in_stack_fffffffffffffcd0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT26(in_stack_fffffffffffffcce,
                            CONCAT24(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT26(in_stack_fffffffffffffcce,
                            CONCAT24(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)));
      }
      else {
        local_1dc = true;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      local_1dc = ValidationState<BlockValidationResult>::Invalid
                            ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffffce8,
                             BVar12,(string *)in_stack_fffffffffffffcd8,
                             (string *)in_stack_fffffffffffffcd0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT26(in_stack_fffffffffffffcce,
                          CONCAT24(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)));
      std::allocator<char>::~allocator(&local_1b4);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT26(in_stack_fffffffffffffcce,
                          CONCAT24(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)));
      std::allocator<char>::~allocator(&local_1b3);
    }
  }
  else {
    std::allocator<char>::allocator();
    BVar12 = (BlockValidationResult)((ulong)in_stack_fffffffffffffce0 >> 0x20);
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    local_1dc = ValidationState<BlockValidationResult>::Invalid
                          ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffffce8,
                           BVar12,(string *)in_stack_fffffffffffffcd8,
                           (string *)in_stack_fffffffffffffcd0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffcce,
                        CONCAT24(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe72);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffcce,
                        CONCAT24(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe73);
  }
LAB_007e32c1:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return local_1dc;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main)
{
    AssertLockHeld(::cs_main);
    assert(pindexPrev != nullptr);
    const int nHeight = pindexPrev->nHeight + 1;

    // Check proof of work
    const Consensus::Params& consensusParams = chainman.GetConsensus();
    if (block.nBits != GetNextWorkRequired(pindexPrev, &block, consensusParams))
        return state.Invalid(BlockValidationResult::BLOCK_INVALID_HEADER, "bad-diffbits", "incorrect proof of work");

    // Check against checkpoints
    if (chainman.m_options.checkpoints_enabled) {
        // Don't accept any forks from the main chain prior to last checkpoint.
        // GetLastCheckpoint finds the last checkpoint in MapCheckpoints that's in our
        // BlockIndex().
        const CBlockIndex* pcheckpoint = blockman.GetLastCheckpoint(chainman.GetParams().Checkpoints());
        if (pcheckpoint && nHeight < pcheckpoint->nHeight) {
            LogPrintf("ERROR: %s: forked chain older than last checkpoint (height %d)\n", __func__, nHeight);
            return state.Invalid(BlockValidationResult::BLOCK_CHECKPOINT, "bad-fork-prior-to-checkpoint");
        }
    }

    // Check timestamp against prev
    if (block.GetBlockTime() <= pindexPrev->GetMedianTimePast())
        return state.Invalid(BlockValidationResult::BLOCK_INVALID_HEADER, "time-too-old", "block's timestamp is too early");

    // Testnet4 and regtest only: Check timestamp against prev for difficulty-adjustment
    // blocks to prevent timewarp attacks (see https://github.com/bitcoin/bitcoin/pull/15482).
    if (consensusParams.enforce_BIP94) {
        // Check timestamp for the first block of each difficulty adjustment
        // interval, except the genesis block.
        if (nHeight % consensusParams.DifficultyAdjustmentInterval() == 0) {
            if (block.GetBlockTime() < pindexPrev->GetBlockTime() - MAX_TIMEWARP) {
                return state.Invalid(BlockValidationResult::BLOCK_INVALID_HEADER, "time-timewarp-attack", "block's timestamp is too early on diff adjustment block");
            }
        }
    }

    // Check timestamp
    if (block.Time() > NodeClock::now() + std::chrono::seconds{MAX_FUTURE_BLOCK_TIME}) {
        return state.Invalid(BlockValidationResult::BLOCK_TIME_FUTURE, "time-too-new", "block timestamp too far in the future");
    }

    // Reject blocks with outdated version
    if ((block.nVersion < 2 && DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_HEIGHTINCB)) ||
        (block.nVersion < 3 && DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_DERSIG)) ||
        (block.nVersion < 4 && DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_CLTV))) {
            return state.Invalid(BlockValidationResult::BLOCK_INVALID_HEADER, strprintf("bad-version(0x%08x)", block.nVersion),
                                 strprintf("rejected nVersion=0x%08x block", block.nVersion));
    }

    return true;
}